

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O1

Task * AI::create_PlayMontage(Task *__return_storage_ptr__,Montage montage)

{
  pointer pfVar1;
  _func_void__Any_data_ptr_Task_ptr_WorldState_ptr_WorldQuerier_ptr *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"playMontage","");
  Task::Task(__return_storage_ptr__,&local_40,Simple);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__->action = PlayMontage;
  std::vector<float,_std::allocator<float>_>::resize(&(__return_storage_ptr__->parameters).values,3)
  ;
  std::vector<Math::Vector3,_std::allocator<Math::Vector3>_>::resize
            (&(__return_storage_ptr__->parameters).vectors,1);
  pfVar1 = (__return_storage_ptr__->parameters).values.
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  *pfVar1 = (float)(int)montage;
  pfVar1[1] = 0.0;
  pfVar1[2] = 0.0;
  local_68._M_unused._0_8_ =
       (undefined8)*(undefined8 *)&(__return_storage_ptr__->setup).super__Function_base._M_functor;
  local_68._8_8_ =
       *(undefined8 *)((long)&(__return_storage_ptr__->setup).super__Function_base._M_functor + 8);
  *(undefined8 *)&(__return_storage_ptr__->setup).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->setup).super__Function_base._M_functor + 8) = 0;
  local_58 = (__return_storage_ptr__->setup).super__Function_base._M_manager;
  (__return_storage_ptr__->setup).super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:85:23)>
       ::_M_manager;
  local_50 = (__return_storage_ptr__->setup)._M_invoker;
  (__return_storage_ptr__->setup)._M_invoker =
       std::
       _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:85:23)>
       ::_M_invoke;
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  local_68._M_unused._M_member_pointer = 3;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  emplace_back<AI::SatisfiablePredicateParams>
            (&(__return_storage_ptr__->postconditions).satisfiedPredicates,
             (SatisfiablePredicateParams *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

Task create_PlayMontage(Montage montage)
	{
		Task playMontage {"playMontage"};		
		playMontage.action = Action::PlayMontage;
		playMontage.parameters.values.resize(3);
		playMontage.parameters.vectors.resize(1);
		playMontage.parameters.values[0] = static_cast<float>(montage);
		playMontage.parameters.values[1] = 0; //0 = needs to be started, 1 = already started
		playMontage.parameters.values[2] = 0; //elapsed time
		playMontage.setup = [](Task& task, const WorldState& state, const WorldQuerier&)
		{
			//parameters.vectors[0] is {current alarm time, total alarm time, UNUSED}
			task.parameters.vectors[0].x = 0;
			task.parameters.vectors[0].y = 1;
		};
		
		playMontage.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::TimeElapsed, 0});

		return playMontage;
	}